

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O3

Rect __thiscall SkylineBinPack::Insert(SkylineBinPack *this,int width,int height)

{
  DisjointRectCollection *this_00;
  bool bVar1;
  Rect RVar2;
  Rect node;
  Rect local_40;
  Rect local_30;
  
  local_40 = GuillotineBinPack::Insert
                       (&this->wasteMap,width,height,true,RectBestShortSideFit,SplitMaximizeArea);
  this_00 = &this->disjointRects;
  bVar1 = DisjointRectCollection::Disjoint(this_00,&local_40);
  RVar2 = local_40;
  if (!bVar1) {
    __assert_fail("disjointRects.Disjoint(node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0x6d,"Rect SkylineBinPack::Insert(int, int)");
  }
  if (local_40.height == 0) {
    RVar2 = InsertBottomLeft(this,width,height);
  }
  else {
    local_30.x = local_40.x;
    local_30.y = local_40.y;
    local_40.width = RVar2.width;
    local_30.width = local_40.width;
    local_30.height = local_40.height;
    this->usedSurfaceArea = this->usedSurfaceArea + (long)(height * width);
    local_40 = RVar2;
    bVar1 = DisjointRectCollection::Disjoint(this_00,&local_30);
    if (!bVar1) {
      __assert_fail("disjointRects.Disjoint(newNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0x79,"Rect SkylineBinPack::Insert(int, int)");
    }
    DisjointRectCollection::Add(this_00,&local_30);
    RVar2.width = local_30.width;
    RVar2.x = local_30.x;
    RVar2.y = local_30.y;
    RVar2.height = local_30.height;
  }
  return RVar2;
}

Assistant:

Rect SkylineBinPack::Insert(int width, int height)
{
	// First try to pack this rectangle into the waste map, if it fits.
	Rect node = wasteMap.Insert(width, height, true, GuillotineBinPack::RectBestShortSideFit, 
		GuillotineBinPack::SplitMaximizeArea);
#ifdef _DEBUG
	assert(disjointRects.Disjoint(node));
#endif

	if (node.height != 0)
	{
		Rect newNode;
		newNode.x = node.x;
		newNode.y = node.y;
		newNode.width = node.width;
		newNode.height = node.height;
		usedSurfaceArea += width * height;
#ifdef _DEBUG
		assert(disjointRects.Disjoint(newNode));
		disjointRects.Add(newNode);
#endif
		return newNode;
	}
	
	return InsertBottomLeft(width, height);
}